

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
StringInstance::op_concatenate
          (string *__return_storage_ptr__,StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *str;
  bool bVar1;
  undefined8 *puVar2;
  char *pcVar3;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  StringInstance local_98;
  
  str = (arguments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x20) {
    bVar1 = Grammar::is_string_value(str);
    if (bVar1) {
      StringInstance(&local_98,
                     (arguments->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,local_98._value._M_dataplus._M_p,
                 local_98._value._M_dataplus._M_p + local_98._value._M_string_length);
      std::__cxx11::string::_M_append((char *)&this->_value,(ulong)local_b8[0]);
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
      ~StringInstance(&local_98);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
      return __return_storage_ptr__;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: invalid argument.";
  }
  else {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: wrong number of arguments.";
  }
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_concatenate(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_string_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    _value += StringInstance(arguments[0]).value();
    return "null";
}